

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icmax1.c
# Opt level: O2

int icmax1_slu(int *n,singlecomplex *cx,int *incx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  singlecomplex *psVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  
  uVar1 = *n;
  if ((int)uVar1 < 1) {
    iVar3 = 0;
  }
  else {
    if (uVar1 == 1) {
      return 1;
    }
    iVar2 = *incx;
    fVar8 = ABS(cx->r);
    if ((long)iVar2 == 1) {
      uVar4 = 1;
      for (uVar5 = 2; iVar3 = (int)uVar4, (ulong)uVar1 + 1 != uVar5; uVar5 = uVar5 + 1) {
        fVar9 = ABS(cx[uVar5 - 1].r);
        if (fVar8 < fVar9) {
          uVar4 = uVar5;
        }
        uVar4 = uVar4 & 0xffffffff;
        fVar8 = (float)(~-(uint)(fVar8 < fVar9) & (uint)fVar8 | (uint)fVar9 & -(uint)(fVar8 < fVar9)
                       );
      }
    }
    else {
      psVar6 = cx + (long)(iVar2 + 1) + -1;
      iVar3 = 1;
      for (iVar7 = 2; iVar7 - uVar1 != 1; iVar7 = iVar7 + 1) {
        fVar9 = ABS(psVar6->r);
        if (fVar8 < fVar9) {
          iVar3 = iVar7;
        }
        fVar8 = (float)(~-(uint)(fVar8 < fVar9) & (uint)fVar8 | (uint)fVar9 & -(uint)(fVar8 < fVar9)
                       );
        psVar6 = psVar6 + iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int icmax1_slu(int *n, singlecomplex *cx, int *incx)
{
/*
       NEXT LINE IS THE ONLY MODIFICATION.   

    
   Parameter adjustments   
       Function Body */
    /* System generated locals */
    int ret_val;
    float r__1;
    /* Local variables */
    float smax;
    int i, ix;


#define CX(I) cx[(I)-1]


    ret_val = 0;
    if (*n < 1) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L30;
    }

/*     CODE FOR INCREMENT NOT EQUAL TO 1 */

    ix = 1;
    smax = (r__1 = CX(1).r, fabs(r__1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if ((r__1 = CX(ix).r, fabs(r__1)) <= smax) {
	    goto L10;
	}
	ret_val = i;
	smax = (r__1 = CX(ix).r, fabs(r__1));
L10:
	ix += *incx;
/* L20: */
    }
    return ret_val;

/*     CODE FOR INCREMENT EQUAL TO 1 */

L30:
    smax = (r__1 = CX(1).r, fabs(r__1));
    for (i = 2; i <= *n; ++i) {
	if ((r__1 = CX(i).r, fabs(r__1)) <= smax) {
	    goto L40;
	}
	ret_val = i;
	smax = (r__1 = CX(i).r, fabs(r__1));
L40:
	;
    }
    return ret_val;

/*     End of ICMAX1 */

}